

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort.cpp
# Opt level: O1

void mergesort_3way_register_hook(void)

{
  routine_register(&mergesort_3way_routine);
  return;
}

Assistant:

static void
mergesort_3way_parallel(unsigned char** strings, size_t n, unsigned char** tmp)
{
	debug() << __func__ << "(), n="<<n<<"\n";
	if (n < 32) {
		insertion_sort(strings, n, 0);
		return;
	}
	const size_t split0 = n/3, split1 = (2*n)/3;
#pragma omp parallel sections
	{
#pragma omp section
		mergesort_3way_parallel(strings,        split0,        tmp);
#pragma omp section
		mergesort_3way_parallel(strings+split0, split1-split0, tmp+split0);
#pragma omp section
		mergesort_3way_parallel(strings+split1, n-split1,      tmp+split1);
	}
	merge_3way(strings, split0,
	           strings+split0, split1-split0,
	           strings+split1, n-split1,
	           tmp);
	(void) memcpy(strings, tmp, n*sizeof(unsigned char*));
}